

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_expr.hpp
# Opt level: O1

rt_expression_interface<double> * __thiscall
viennamath::
op_unary<viennamath::op_rt_integral<viennamath::rt_expression_interface<double>_>,_viennamath::rt_expression_interface<double>_>
::simplify(op_unary<viennamath::op_rt_integral<viennamath::rt_expression_interface<double>_>,_viennamath::rt_expression_interface<double>_>
           *this,rt_expression_interface<double> *lhs,rt_expression_interface<double> *rhs)

{
  int iVar1;
  int iVar2;
  rt_expression_interface<double> *prVar3;
  undefined4 extraout_var;
  _func_int **pp_Var4;
  undefined4 extraout_var_00;
  
  prVar3 = (rt_expression_interface<double> *)operator_new(0x20);
  iVar1 = (*lhs->_vptr_rt_expression_interface[2])(lhs);
  pp_Var4 = (_func_int **)operator_new(0x28);
  *pp_Var4 = (_func_int *)&PTR__op_unary_00118a78;
  rt_interval<viennamath::rt_expression_interface<double>_>::rt_interval
            ((rt_interval<viennamath::rt_expression_interface<double>_> *)(pp_Var4 + 1));
  pp_Var4[3] = (_func_int *)&PTR__rt_expression_interface_00118718;
  pp_Var4[4] = (_func_int *)0x0;
  iVar2 = (*rhs->_vptr_rt_expression_interface[2])(rhs);
  prVar3->_vptr_rt_expression_interface = (_func_int **)&PTR__rt_binary_expr_00118468;
  prVar3[1]._vptr_rt_expression_interface = (_func_int **)CONCAT44(extraout_var,iVar1);
  prVar3[2]._vptr_rt_expression_interface = pp_Var4;
  prVar3[3]._vptr_rt_expression_interface = (_func_int **)CONCAT44(extraout_var_00,iVar2);
  return prVar3;
}

Assistant:

InterfaceType * op_unary<T, InterfaceType>::simplify(const InterfaceType * lhs,
                                                       const InterfaceType * rhs) const
  {
    return new rt_binary_expr<InterfaceType>(lhs->clone(),
                                          new op_unary<T, InterfaceType>(),
                                          rhs->clone());
  }